

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_lifo.h
# Opt level: O0

void * lf_lifo_pop(lf_lifo *head)

{
  void *a;
  lf_lifo *plVar1;
  lf_lifo *plVar2;
  intptr_t iVar3;
  void *pvVar4;
  void *__e;
  void **__ep;
  void *next;
  void *newhead;
  lf_lifo *elem;
  void *tail;
  lf_lifo *head_local;
  
  do {
    a = head->next;
    plVar1 = lf_lifo(a);
    if (plVar1 == (lf_lifo *)0x0) {
      return (void *)0x0;
    }
    plVar2 = lf_lifo(plVar1->next);
    if (plVar2 == (lf_lifo *)0x0) {
      next = (void *)aba_value(a);
    }
    else {
      iVar3 = aba_value(a);
      next = (void *)((long)&plVar2->next + iVar3);
    }
    LOCK();
    pvVar4 = head->next;
    if (a == pvVar4) {
      head->next = next;
      pvVar4 = a;
    }
    UNLOCK();
  } while (pvVar4 != a);
  return plVar1;
}

Assistant:

static inline void *
lf_lifo_pop(struct lf_lifo *head)
{
	do {
		void *tail = head->next;
		struct lf_lifo *elem = lf_lifo(tail);
		if (elem == NULL)
			return NULL;
		/*
		 * Discard the old tail's aba value, then save
		 * the old head's value in the tail.
		 * This way head's aba value grows monotonically
		 * regardless of the exact sequence of push/pop
		 * operations.
		 */
		void *newhead;
		void *next = lf_lifo(elem->next);
		if (next != NULL)
			newhead = (char *)next + aba_value(tail);
		else
			newhead = (void *)aba_value(tail);
		if (pm_atomic_compare_exchange_weak(&head->next, &tail, newhead))
			return elem;
	} while (true);
}